

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonlinear_beamformer.cc
# Opt level: O0

void __thiscall webrtc::NonlinearBeamformer::ApplyMaskFrequencySmoothing(NonlinearBeamformer *this)

{
  long local_20;
  size_t i_1;
  size_t i;
  NonlinearBeamformer *this_local;
  
  std::copy<float*,float*>(this->time_smooth_mask_,this->final_mask_,this->final_mask_);
  for (i_1 = this->low_mean_start_bin_; i_1 < 0x81; i_1 = i_1 + 1) {
    this->final_mask_[i_1] = this->final_mask_[i_1] * 0.6 + this->final_mask_[i_1 - 1] * 0.39999998;
  }
  for (local_20 = this->high_mean_end_bin_ + 1; local_20 != 0; local_20 = local_20 + -1) {
    this->final_mask_[local_20 + -1] =
         this->final_mask_[local_20 + -1] * 0.6 + this->final_mask_[local_20] * 0.39999998;
  }
  return;
}

Assistant:

void NonlinearBeamformer::ApplyMaskFrequencySmoothing() {
  // Smooth over frequency in both directions. The "frequency correction"
  // regions have constant value, but we enter them to smooth over the jump
  // that exists at the boundary. However, this does mean when smoothing "away"
  // from the region that we only need to use the last element.
  //
  // Upward smoothing:
  //   low_mean_start_bin_
  //         v
  // |------|------------|------|
  //       ^------------------>^
  //
  // Downward smoothing:
  //         high_mean_end_bin_
  //                    v
  // |------|------------|------|
  //  ^<------------------^
  std::copy(time_smooth_mask_, time_smooth_mask_ + kNumFreqBins, final_mask_);
  for (size_t i = low_mean_start_bin_; i < kNumFreqBins; ++i) {
    final_mask_[i] = kMaskFrequencySmoothAlpha * final_mask_[i] +
                     (1 - kMaskFrequencySmoothAlpha) * final_mask_[i - 1];
  }
  for (size_t i = high_mean_end_bin_ + 1; i > 0; --i) {
    final_mask_[i - 1] = kMaskFrequencySmoothAlpha * final_mask_[i - 1] +
                         (1 - kMaskFrequencySmoothAlpha) * final_mask_[i];
  }
}